

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmemarena.h
# Opt level: O3

void * __thiscall
cookmem::CachedArena<cookmem::MallocArena>::getSegment
          (CachedArena<cookmem::MallocArena> *this,size_t *size)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  void *pvVar3;
  ulong __size;
  
  iVar2 = PtrAVLTree::remove(&this->m_tree,(char *)size);
  if ((void *)CONCAT44(extraout_var,iVar2) != (void *)0x0) {
    return (void *)CONCAT44(extraout_var,iVar2);
  }
  uVar1 = this->m_arena->m_minSize;
  __size = *size;
  if (*size < uVar1) {
    *size = uVar1;
    __size = uVar1;
  }
  pvVar3 = malloc(__size);
  return pvVar3;
}

Assistant:

void*
    getSegment (std::size_t& size)
    {
        void* seg = m_tree.remove(size);
        if (seg)
        {
            return seg;
        }
        return m_arena.getSegment(size);
    }